

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

string * __thiscall
lest::to_string<bool,bool>(string *__return_storage_ptr__,lest *this,bool *lhs,string *op,bool *rhs)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  ostringstream os;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar1 = "client.HaveWorker() == false";
  pcVar2 = "client.HaveWorker() == false";
  if ((ulong)(byte)*this != 0) {
    pcVar2 = "client.HaveWorker() == true";
  }
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,pcVar2 + 0x17,pcVar2 + 0x17 + ((ulong)(byte)*this ^ 5));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1e8,local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)lhs,*(long *)(lhs + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  uVar4 = (ulong)*(byte *)&(op->_M_dataplus)._M_p;
  if (uVar4 != 0) {
    pcVar1 = "client.HaveWorker() == true";
  }
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,pcVar1 + 0x17,pcVar1 + 0x17 + (uVar4 ^ 5));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1c8,local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}